

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_>::FindKey
          (TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_> *this,FString *key)

{
  hash_t hVar1;
  Node *pNVar2;
  DWORD DVar3;
  int iVar4;
  char *in_RAX;
  Node *pNVar5;
  FString local_28;
  
  local_28.Chars = in_RAX;
  FString::AttachToOther(&local_28,key);
  pNVar2 = this->Nodes;
  DVar3 = SuperFastHash(local_28.Chars,(ulong)*(uint *)(local_28.Chars + -0xc));
  hVar1 = this->Size;
  FString::~FString(&local_28);
  pNVar2 = pNVar2 + (hVar1 - 1 & DVar3);
  while ((pNVar5 = pNVar2, pNVar5 != (Node *)0x0 && (pNVar2 = pNVar5->Next, pNVar2 != (Node *)0x1)))
  {
    iVar4 = strcmp((pNVar5->Pair).Key.Chars,key->Chars);
    if (iVar4 == 0) {
      return pNVar5;
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *FindKey(const KT key)
	{
		HashTraits Traits;
		Node *n = MainPosition(key);
		while (n != NULL && !n->IsNil() && Traits.Compare(n->Pair.Key, key))
		{
			n = n->Next;
		}
		return n == NULL || n->IsNil() ? NULL : n;
	}